

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

void __thiscall
ON_Annotation::SetMaskFillType(ON_Annotation *this,ON_DimStyle *parent_style,MaskType value)

{
  MaskType MVar1;
  ON_DimStyle *pOVar2;
  
  pOVar2 = ON_DimStyle::DimStyleOrDefault(parent_style);
  MVar1 = ON_DimStyle::MaskFillType(pOVar2);
  pOVar2 = Internal_GetOverrideStyle(this,MVar1 != value);
  if (pOVar2 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetMaskFillType(pOVar2,value);
    ON_DimStyle::SetFieldOverride(pOVar2,MaskColorSource,MVar1 != value);
    return;
  }
  return;
}

Assistant:

void ON_Annotation::SetMaskFillType(const ON_DimStyle* parent_style, ON_TextMask::MaskType value)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = (value != parent_style->MaskFillType());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetMaskFillType(value);
    override_style->SetFieldOverride(ON_DimStyle::field::MaskColorSource, bCreate);
  }
}